

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blend_a64_mask.c
# Opt level: O0

void aom_highbd_blend_a64_d16_mask_c
               (uint8_t *dst_8,uint32_t dst_stride,CONV_BUF_TYPE *src0,uint32_t src0_stride,
               CONV_BUF_TYPE *src1,uint32_t src1_stride,uint8_t *mask,uint32_t mask_stride,int w,
               int h,int subw,int subh,ConvolveParams *conv_params,int bd)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  uint in_ECX;
  long in_RDX;
  uint in_ESI;
  long in_RDI;
  long in_R8;
  uint in_R9D;
  long in_stack_00000008;
  uint in_stack_00000010;
  int in_stack_00000018;
  int in_stack_00000020;
  uint v_3;
  int m_3;
  int32_t res_3;
  int j_3;
  int i_3;
  uint v_2;
  int m_2;
  int32_t res_2;
  int j_2;
  int i_2;
  uint v_1;
  int m_1;
  int32_t res_1;
  int j_1;
  int i_1;
  uint v;
  int m;
  int32_t res;
  int j;
  int i;
  uint saturation_value;
  uint16_t *dst;
  int round_bits;
  int round_offset;
  int offset_bits;
  uint local_ac;
  uint local_a8;
  uint local_a4;
  uint local_a0;
  int local_88;
  int local_84;
  int local_74;
  int local_70;
  int local_60;
  int local_5c;
  int local_4c;
  int local_48;
  uint local_44;
  long local_40;
  long local_28;
  long local_18;
  
  bVar1 = (((char)res_2 - (char)*(undefined4 *)(_v_2 + 0x14)) + '\x0e') -
          (char)*(undefined4 *)(_v_2 + 0x18);
  iVar2 = (1 << (bVar1 & 0x1f)) + (1 << (bVar1 - 1 & 0x1f));
  bVar1 = 0xe - ((char)*(undefined4 *)(_v_2 + 0x14) + (char)*(undefined4 *)(_v_2 + 0x18));
  local_40 = in_RDI * 2;
  if (res_2 != 8) {
    if (res_2 == 10) {
      local_44 = 0x3ff;
      goto LAB_00374857;
    }
    if (res_2 == 0xc) {
      local_44 = 0xfff;
      goto LAB_00374857;
    }
  }
  local_44 = 0xff;
LAB_00374857:
  local_28 = in_R8;
  local_18 = in_RDX;
  if ((m_3 == 0) && (j_3 == 0)) {
    for (local_48 = 0; local_48 < in_stack_00000020; local_48 = local_48 + 1) {
      for (local_4c = 0; local_4c < in_stack_00000018; local_4c = local_4c + 1) {
        local_a0 = negative_to_zero((((int)((uint)*(byte *)(in_stack_00000008 + local_4c) *
                                            (uint)*(ushort *)(local_18 + (long)local_4c * 2) +
                                           (0x40 - (uint)*(byte *)(in_stack_00000008 + local_4c)) *
                                           (uint)*(ushort *)(local_28 + (long)local_4c * 2)) >> 6) -
                                    iVar2) + ((1 << (bVar1 & 0x1f)) >> 1) >> (bVar1 & 0x1f));
        if (local_44 <= local_a0) {
          local_a0 = local_44;
        }
        *(short *)(local_40 + (long)local_4c * 2) = (short)local_a0;
      }
      in_stack_00000008 = in_stack_00000008 + (ulong)in_stack_00000010;
      local_18 = local_18 + (ulong)in_ECX * 2;
      local_28 = local_28 + (ulong)in_R9D * 2;
      local_40 = local_40 + (ulong)in_ESI * 2;
    }
  }
  else if ((m_3 == 1) && (j_3 == 1)) {
    for (local_5c = 0; local_5c < in_stack_00000020; local_5c = local_5c + 1) {
      for (local_60 = 0; local_60 < in_stack_00000018; local_60 = local_60 + 1) {
        iVar3 = (int)((uint)*(byte *)(in_stack_00000008 + (local_60 << 1)) +
                      (uint)*(byte *)(in_stack_00000008 + (ulong)(in_stack_00000010 + local_60 * 2))
                      + (uint)*(byte *)(in_stack_00000008 + (local_60 * 2 + 1)) +
                      (uint)*(byte *)(in_stack_00000008 +
                                     (ulong)(in_stack_00000010 + local_60 * 2 + 1)) + 2) >> 2;
        local_a4 = negative_to_zero((((int)(iVar3 * (uint)*(ushort *)(local_18 + (long)local_60 * 2)
                                           + (0x40 - iVar3) *
                                             (uint)*(ushort *)(local_28 + (long)local_60 * 2)) >> 6)
                                    - iVar2) + ((1 << (bVar1 & 0x1f)) >> 1) >> (bVar1 & 0x1f));
        if (local_44 <= local_a4) {
          local_a4 = local_44;
        }
        *(short *)(local_40 + (long)local_60 * 2) = (short)local_a4;
      }
      in_stack_00000008 = in_stack_00000008 + (ulong)(in_stack_00000010 << 1);
      local_18 = local_18 + (ulong)in_ECX * 2;
      local_28 = local_28 + (ulong)in_R9D * 2;
      local_40 = local_40 + (ulong)in_ESI * 2;
    }
  }
  else if ((m_3 == 1) && (j_3 == 0)) {
    for (local_70 = 0; local_70 < in_stack_00000020; local_70 = local_70 + 1) {
      for (local_74 = 0; local_74 < in_stack_00000018; local_74 = local_74 + 1) {
        iVar3 = (int)((uint)*(byte *)(in_stack_00000008 + (local_74 << 1)) +
                      (uint)*(byte *)(in_stack_00000008 + (local_74 * 2 + 1)) + 1) >> 1;
        local_a8 = negative_to_zero((((int)(iVar3 * (uint)*(ushort *)(local_18 + (long)local_74 * 2)
                                           + (0x40 - iVar3) *
                                             (uint)*(ushort *)(local_28 + (long)local_74 * 2)) >> 6)
                                    - iVar2) + ((1 << (bVar1 & 0x1f)) >> 1) >> (bVar1 & 0x1f));
        if (local_44 <= local_a8) {
          local_a8 = local_44;
        }
        *(short *)(local_40 + (long)local_74 * 2) = (short)local_a8;
      }
      in_stack_00000008 = in_stack_00000008 + (ulong)in_stack_00000010;
      local_18 = local_18 + (ulong)in_ECX * 2;
      local_28 = local_28 + (ulong)in_R9D * 2;
      local_40 = local_40 + (ulong)in_ESI * 2;
    }
  }
  else {
    for (local_84 = 0; local_84 < in_stack_00000020; local_84 = local_84 + 1) {
      for (local_88 = 0; local_88 < in_stack_00000018; local_88 = local_88 + 1) {
        iVar3 = (int)((uint)*(byte *)(in_stack_00000008 + local_88) +
                      (uint)*(byte *)(in_stack_00000008 + (ulong)(in_stack_00000010 + local_88)) + 1
                     ) >> 1;
        local_ac = negative_to_zero((((int)(iVar3 * (uint)*(ushort *)(local_18 + (long)local_88 * 2)
                                           + (0x40 - iVar3) *
                                             (uint)*(ushort *)(local_28 + (long)local_88 * 2)) >> 6)
                                    - iVar2) + ((1 << (bVar1 & 0x1f)) >> 1) >> (bVar1 & 0x1f));
        if (local_44 <= local_ac) {
          local_ac = local_44;
        }
        *(short *)(local_40 + (long)local_88 * 2) = (short)local_ac;
      }
      in_stack_00000008 = in_stack_00000008 + (ulong)(in_stack_00000010 << 1);
      local_18 = local_18 + (ulong)in_ECX * 2;
      local_28 = local_28 + (ulong)in_R9D * 2;
      local_40 = local_40 + (ulong)in_ESI * 2;
    }
  }
  return;
}

Assistant:

void aom_highbd_blend_a64_d16_mask_c(
    uint8_t *dst_8, uint32_t dst_stride, const CONV_BUF_TYPE *src0,
    uint32_t src0_stride, const CONV_BUF_TYPE *src1, uint32_t src1_stride,
    const uint8_t *mask, uint32_t mask_stride, int w, int h, int subw, int subh,
    ConvolveParams *conv_params, const int bd) {
  const int offset_bits = bd + 2 * FILTER_BITS - conv_params->round_0;
  const int round_offset = (1 << (offset_bits - conv_params->round_1)) +
                           (1 << (offset_bits - conv_params->round_1 - 1));
  const int round_bits =
      2 * FILTER_BITS - conv_params->round_0 - conv_params->round_1;
  uint16_t *dst = CONVERT_TO_SHORTPTR(dst_8);

  assert(IMPLIES(src0 == dst, src0_stride == dst_stride));
  assert(IMPLIES(src1 == dst, src1_stride == dst_stride));

  assert(h >= 1);
  assert(w >= 1);
  assert(IS_POWER_OF_TWO(h));
  assert(IS_POWER_OF_TWO(w));

  // excerpt from clip_pixel_highbd()
  // set saturation_value to (1 << bd) - 1
  unsigned int saturation_value;
  switch (bd) {
    case 8:
    default: saturation_value = 255; break;
    case 10: saturation_value = 1023; break;
    case 12: saturation_value = 4095; break;
  }

  if (subw == 0 && subh == 0) {
    for (int i = 0; i < h; ++i) {
      for (int j = 0; j < w; ++j) {
        int32_t res;
        const int m = mask[j];
        res = ((m * src0[j] + (AOM_BLEND_A64_MAX_ALPHA - m) * src1[j]) >>
               AOM_BLEND_A64_ROUND_BITS);
        res -= round_offset;
        unsigned int v = negative_to_zero(ROUND_POWER_OF_TWO(res, round_bits));
        dst[j] = AOMMIN(v, saturation_value);
      }
      mask += mask_stride;
      src0 += src0_stride;
      src1 += src1_stride;
      dst += dst_stride;
    }
  } else if (subw == 1 && subh == 1) {
    for (int i = 0; i < h; ++i) {
      for (int j = 0; j < w; ++j) {
        int32_t res;
        const int m = ROUND_POWER_OF_TWO(
            mask[2 * j] + mask[mask_stride + 2 * j] + mask[2 * j + 1] +
                mask[mask_stride + 2 * j + 1],
            2);
        res = (m * src0[j] + (AOM_BLEND_A64_MAX_ALPHA - m) * src1[j]) >>
              AOM_BLEND_A64_ROUND_BITS;
        res -= round_offset;
        unsigned int v = negative_to_zero(ROUND_POWER_OF_TWO(res, round_bits));
        dst[j] = AOMMIN(v, saturation_value);
      }
      mask += 2 * mask_stride;
      src0 += src0_stride;
      src1 += src1_stride;
      dst += dst_stride;
    }
  } else if (subw == 1 && subh == 0) {
    for (int i = 0; i < h; ++i) {
      for (int j = 0; j < w; ++j) {
        int32_t res;
        const int m = AOM_BLEND_AVG(mask[2 * j], mask[2 * j + 1]);
        res = (m * src0[j] + (AOM_BLEND_A64_MAX_ALPHA - m) * src1[j]) >>
              AOM_BLEND_A64_ROUND_BITS;
        res -= round_offset;
        unsigned int v = negative_to_zero(ROUND_POWER_OF_TWO(res, round_bits));
        dst[j] = AOMMIN(v, saturation_value);
      }
      mask += mask_stride;
      src0 += src0_stride;
      src1 += src1_stride;
      dst += dst_stride;
    }
  } else {
    for (int i = 0; i < h; ++i) {
      for (int j = 0; j < w; ++j) {
        int32_t res;
        const int m = AOM_BLEND_AVG(mask[j], mask[mask_stride + j]);
        res = (m * src0[j] + (AOM_BLEND_A64_MAX_ALPHA - m) * src1[j]) >>
              AOM_BLEND_A64_ROUND_BITS;
        res -= round_offset;
        unsigned int v = negative_to_zero(ROUND_POWER_OF_TWO(res, round_bits));
        dst[j] = AOMMIN(v, saturation_value);
      }
      mask += 2 * mask_stride;
      src0 += src0_stride;
      src1 += src1_stride;
      dst += dst_stride;
    }
  }
}